

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdbfile.cpp
# Opt level: O1

bool ReadDebugInfo(char *fileName,DebugInfo *to)

{
  pointer *ppCVar1;
  undefined2 uVar2;
  iterator __position;
  size_type sVar3;
  pointer pcVar4;
  pointer pPVar5;
  size_type sVar6;
  DebugInfo *this;
  bool bVar7;
  ErrorCode EVar8;
  uint32_t uVar9;
  int32_t iVar10;
  Record *pRVar11;
  size_t sVar12;
  SectionContrib *pSVar13;
  uint uVar14;
  undefined1 uVar15;
  SectionType SVar16;
  undefined8 uVar17;
  long lVar18;
  char *__format;
  ulong uVar19;
  pointer pPVar20;
  uint32_t uVar21;
  __normal_iterator<PDBSymbol_*,_std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>_> __i;
  pointer pPVar22;
  size_type sVar23;
  ulong uVar24;
  __node_base _Var25;
  long lVar26;
  short sVar27;
  HashRecord *hashRecord;
  Module *this_00;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  vector<SectionContrib,_std::allocator<SectionContrib>_> contributions;
  ModuleSymbolStream moduleSymbolStream;
  vector<PDBSymbol,_std::allocator<PDBSymbol>_> rvaSortedSymbols;
  unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  typeSizeCache;
  RVAToSymbolMap rvaToSymbol;
  CoalescedMSFStream symbolRecordStream;
  RawFile rawPdbFile;
  ImageSectionStream imageSectionStream;
  MemoryMappedFile pdbFile;
  ModuleInfoStream moduleInfoStream;
  InfoStream infoStream;
  SectionContributionStream sectionContributionStream;
  DBIStream dbiStream;
  TypeTable typeTable;
  vector<SectionContrib,_std::allocator<SectionContrib>_> local_318;
  undefined4 local_2fc;
  undefined1 local_2f8 [20];
  int32_t iStack_2e4;
  undefined8 local_2e0;
  StreamHeader local_2d8;
  vector<PDBSymbol,_std::allocator<PDBSymbol>_> local_298;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_278;
  undefined1 local_240 [16];
  __node_base local_230;
  size_type sStack_228;
  float local_220;
  size_t local_218;
  __node_base_ptr p_Stack_210;
  double local_208;
  double dStack_200;
  DebugInfo *local_1f8;
  double dStack_1f0;
  CoalescedMSFStream local_1e0;
  RawFile local_1c8;
  undefined4 local_188 [2];
  size_t local_180;
  ImageSectionStream local_178;
  MemoryMappedFile local_150;
  ModuleInfoStream local_138;
  InfoStream local_110;
  SectionContributionStream local_e8;
  DBIStream local_c0;
  TypeTable local_60;
  
  MemoryMappedFile::MemoryMappedFile(&local_150,fileName);
  if (local_150.baseAddress == (void *)0x0) {
    uVar15 = 0;
    fprintf(_stderr,"  failed to memory-map PDB file \'%s\'\n",fileName);
    goto LAB_0010bb85;
  }
  EVar8 = PDB::ValidateFile(local_150.baseAddress);
  if (EVar8 != Success) {
    uVar15 = 0;
    fprintf(_stderr,"  failed to validate PDB file \'%s\': error code %i\n",fileName,(ulong)EVar8);
    goto LAB_0010bb85;
  }
  PDB::CreateRawFile(&local_1c8,local_150.baseAddress);
  EVar8 = PDB::HasValidDBIStream(&local_1c8);
  if (EVar8 == Success) {
    PDB::InfoStream::InfoStream(&local_110,&local_1c8);
    if (local_110.m_usesDebugFastlink == true) {
      __format = "  PDB file \'%s\' uses unsupported option /DEBUG:FASTLINK\n";
      uVar17 = 0;
LAB_0010b4af:
      uVar15 = (undefined1)uVar17;
      fprintf(_stderr,__format,fileName);
    }
    else {
      PDB::CreateDBIStream(&local_c0,&local_1c8);
      EVar8 = PDB::DBIStream::HasValidImageSectionStream(&local_c0,&local_1c8);
      if (((EVar8 == Success) &&
          (EVar8 = PDB::DBIStream::HasValidPublicSymbolStream(&local_c0,&local_1c8),
          EVar8 == Success)) &&
         (EVar8 = PDB::DBIStream::HasValidGlobalSymbolStream(&local_c0,&local_1c8), EVar8 == Success
         )) {
        EVar8 = PDB::DBIStream::HasValidSectionContributionStream(&local_c0,&local_1c8);
        uVar17 = CONCAT71((int7)((ulong)&local_c0 >> 8),EVar8 == Success);
      }
      else {
        uVar17 = 0;
      }
      if ((char)uVar17 == '\0') {
        __format = "  PDB file \'%s\' does not have required DBI sections\n";
        goto LAB_0010b4af;
      }
      local_2fc = (undefined4)uVar17;
      ReadDebugInfo();
      fwrite("[      ]",8,1,_stderr);
      PDB::DBIStream::CreateImageSectionStream(&local_178,&local_c0,&local_1c8);
      PDB::DBIStream::CreateModuleInfoStream(&local_138,&local_c0,&local_1c8);
      PDB::DBIStream::CreateSectionContributionStream(&local_e8,&local_c0,&local_1c8);
      PDB::DBIStream::CreateSymbolRecordStream(&local_1e0,&local_c0,&local_1c8);
      local_318.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl.
      super__Vector_impl_data._M_start = (SectionContrib *)0x0;
      local_318.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl.
      super__Vector_impl_data._M_finish = (SectionContrib *)0x0;
      local_318.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (SectionContrib *)0x0;
      std::vector<SectionContrib,_std::allocator<SectionContrib>_>::reserve
                (&local_318,local_e8.m_count);
      std::vector<ContribInfo,_std::allocator<ContribInfo>_>::reserve
                (&to->m_Contribs,local_e8.m_count);
      if (local_e8.m_count != 0) {
        auVar28._8_4_ = (int)(local_e8.m_count >> 0x20);
        auVar28._0_8_ = local_e8.m_count;
        auVar28._12_4_ = 0x45300000;
        dStack_1f0 = auVar28._8_8_ - 1.9342813113834067e+25;
        local_1f8 = (DebugInfo *)
                    (dStack_1f0 +
                    ((double)CONCAT44(0x43300000,(int)local_e8.m_count) - 4503599627370496.0));
        sVar27 = 1;
        lVar18 = 0;
        do {
          if (sVar27 == 0) {
            ReadDebugInfo();
          }
          uVar9 = PDB::ImageSectionStream::ConvertSectionOffsetToRVA
                            (&local_178,
                             *(uint16_t *)((long)&(local_e8.m_contributions)->section + lVar18),
                             *(uint32_t *)((long)&(local_e8.m_contributions)->offset + lVar18));
          if (uVar9 == 0) {
            fprintf(_stderr,"  Contribution (section %i, offset %i) has invalid RVA\n",
                    (ulong)*(ushort *)((long)&(local_e8.m_contributions)->section + lVar18),
                    (ulong)*(uint *)((long)&(local_e8.m_contributions)->offset + lVar18));
          }
          else {
            local_2f8._2_2_ = 0;
            local_2f8._0_2_ = *(ushort *)((long)&(local_e8.m_contributions)->section + lVar18);
            local_2f8._4_4_ = *(undefined4 *)((long)&(local_e8.m_contributions)->offset + lVar18);
            local_2f8._12_2_ = *(ushort *)((long)&(local_e8.m_contributions)->moduleIndex + lVar18);
            local_2f8._8_4_ = *(undefined4 *)((long)&(local_e8.m_contributions)->size + lVar18);
            local_2f8._14_2_ = 0;
            uVar14 = *(uint *)((long)&(local_e8.m_contributions)->characteristics + lVar18);
            if (((byte)uVar14 & 0xe0) == 0x20) {
              local_2f8._16_4_ = 1;
            }
            else {
              uVar14 = uVar14 & 0xe0;
              if (uVar14 == 0x80) {
                local_2f8._16_4_ = 3;
              }
              else if (uVar14 == 0x40) {
                local_2f8._16_4_ = 2;
              }
              else {
                local_2f8._16_4_ = 0;
              }
            }
            iStack_2e4 = 0;
            iVar10 = DebugInfo::GetObjectFileIndex
                               (to,local_138.m_modules[(ushort)local_2f8._12_2_].m_name);
            iStack_2e4 = iVar10;
            if (local_318.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_318.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<SectionContrib,std::allocator<SectionContrib>>::
              _M_realloc_insert<SectionContrib&>
                        ((vector<SectionContrib,std::allocator<SectionContrib>> *)&local_318,
                         (iterator)
                         local_318.
                         super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl
                         .super__Vector_impl_data._M_finish,(SectionContrib *)local_2f8);
            }
            else {
              (local_318.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl
               .super__Vector_impl_data._M_finish)->Type = local_2f8._16_4_;
              (local_318.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl
               .super__Vector_impl_data._M_finish)->ObjFileIndex = iVar10;
              (local_318.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl
               .super__Vector_impl_data._M_finish)->Section = local_2f8._0_4_;
              (local_318.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl
               .super__Vector_impl_data._M_finish)->Offset = local_2f8._4_4_;
              (local_318.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl
               .super__Vector_impl_data._M_finish)->Length = local_2f8._8_4_;
              (local_318.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl
               .super__Vector_impl_data._M_finish)->Compiland = local_2f8._12_4_;
              local_318.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_318.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            local_240._8_4_ = local_2f8._16_4_;
            local_240._4_4_ = local_2f8._8_4_;
            local_240._0_4_ = iStack_2e4;
            __position._M_current =
                 (to->m_Contribs).super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (to->m_Contribs).super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<ContribInfo,std::allocator<ContribInfo>>::_M_realloc_insert<ContribInfo&>
                        ((vector<ContribInfo,std::allocator<ContribInfo>> *)&to->m_Contribs,
                         __position,(ContribInfo *)local_240);
            }
            else {
              (__position._M_current)->sectionType = local_2f8._16_4_;
              (__position._M_current)->objectFileIndex = iStack_2e4;
              (__position._M_current)->size = local_2f8._8_4_;
              ppCVar1 = &(to->m_Contribs).
                         super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppCVar1 = *ppCVar1 + 1;
            }
          }
          sVar27 = sVar27 + 1;
          lVar18 = lVar18 + 0x1c;
        } while (local_e8.m_count * 0x1c != lVar18);
      }
      local_240._0_8_ = &p_Stack_210;
      local_240._8_8_ = 1;
      local_230._M_nxt = (_Hash_node_base *)0x0;
      sStack_228 = 0;
      local_220 = 1.0;
      local_218 = 0;
      p_Stack_210 = (__node_base_ptr)0x0;
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_PDBSymbol>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::rehash((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_PDBSymbol>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)local_240,0x400);
      local_1f8 = to;
      if (local_138.m_moduleCount != 0) {
        auVar29._8_4_ = (int)(local_138.m_moduleCount >> 0x20);
        auVar29._0_8_ = local_138.m_moduleCount;
        auVar29._12_4_ = 0x45300000;
        dStack_200 = auVar29._8_8_ - 1.9342813113834067e+25;
        local_208 = dStack_200 +
                    ((double)CONCAT44(0x43300000,(int)local_138.m_moduleCount) - 4503599627370496.0)
        ;
        uVar19 = 0;
        this_00 = local_138.m_modules;
        do {
          uVar19 = uVar19 + 1;
          if ((uVar19 & 0x7f) == 0) {
            ReadDebugInfo();
          }
          bVar7 = PDB::ModuleInfoStream::Module::HasSymbolStream(this_00);
          if (bVar7) {
            PDB::ModuleInfoStream::Module::CreateSymbolStream
                      ((ModuleSymbolStream *)local_2f8,this_00,&local_1c8);
            if (4 < (ulong)stack0xfffffffffffffd18) {
              uVar24 = 4;
              do {
                uVar2 = *(undefined2 *)(local_2f8._8_8_ + uVar24);
                ProcessSymbol(&local_178,(Record *)(local_2f8._8_8_ + uVar24),
                              (RVAToSymbolMap *)local_240);
                uVar24 = uVar24 + ((ushort)uVar2 - 2) + 7 & 0xfffffffffffffffc;
              } while (uVar24 < (ulong)stack0xfffffffffffffd18);
            }
            PDB::CoalescedMSFStream::~CoalescedMSFStream((CoalescedMSFStream *)local_2f8);
          }
          this_00 = this_00 + 1;
        } while (this_00 != local_138.m_modules + local_138.m_moduleCount);
      }
      PDB::DBIStream::CreateGlobalSymbolStream((GlobalSymbolStream *)local_2f8,&local_c0,&local_1c8)
      ;
      if ((local_2d8._0_8_ & 0xffffffff) != 0) {
        lVar18 = (local_2d8._0_8_ & 0xffffffff) << 3;
        uVar17 = local_2e0;
        do {
          pRVar11 = PDB::GlobalSymbolStream::GetRecord
                              ((GlobalSymbolStream *)local_2f8,&local_1e0,(HashRecord *)uVar17);
          ProcessSymbol(&local_178,pRVar11,(RVAToSymbolMap *)local_240);
          uVar17 = uVar17 + 8;
          lVar18 = lVar18 + -8;
        } while (lVar18 != 0);
      }
      PDB::CoalescedMSFStream::~CoalescedMSFStream((CoalescedMSFStream *)local_2f8);
      PDB::DBIStream::CreatePublicSymbolStream((PublicSymbolStream *)local_2f8,&local_c0,&local_1c8)
      ;
      if ((local_2d8._0_8_ & 0xffffffff) != 0) {
        lVar18 = (local_2d8._0_8_ & 0xffffffff) << 3;
        uVar17 = local_2e0;
        do {
          pRVar11 = PDB::PublicSymbolStream::GetRecord
                              ((PublicSymbolStream *)local_2f8,&local_1e0,(HashRecord *)uVar17);
          ProcessSymbol(&local_178,pRVar11,(RVAToSymbolMap *)local_240);
          uVar17 = uVar17 + 8;
          lVar18 = lVar18 + -8;
        } while (lVar18 != 0);
      }
      PDB::CoalescedMSFStream::~CoalescedMSFStream((CoalescedMSFStream *)local_2f8);
      sVar6 = sStack_228;
      local_298.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_298.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_298.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>::reserve(&local_298,sStack_228);
      if (local_230._M_nxt != (_Hash_node_base *)0x0) {
        _Var25._M_nxt = local_230._M_nxt;
        do {
          std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>::push_back
                    (&local_298,(value_type *)(_Var25._M_nxt + 2));
          _Var25._M_nxt = (_Var25._M_nxt)->_M_nxt;
        } while (_Var25._M_nxt != (_Hash_node_base *)0x0);
      }
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_PDBSymbol>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_PDBSymbol>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)local_240);
      pPVar20 = local_298.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pPVar5 = local_298.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_298.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_298.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        lVar26 = (long)local_298.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_298.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
                       super__Vector_impl_data._M_start;
        uVar19 = (lVar26 >> 3) * 0x6db6db6db6db6db7;
        lVar18 = 0x3f;
        if (uVar19 != 0) {
          for (; uVar19 >> lVar18 == 0; lVar18 = lVar18 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<PDBSymbol*,std::vector<PDBSymbol,std::allocator<PDBSymbol>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ReadEverything(PDB::RawFile_const&,PDB::DBIStream_const&,DebugInfo&)::__1>>
                  (local_298.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_298.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
                   super__Vector_impl_data._M_finish,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar26 < 0x381) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<PDBSymbol*,std::vector<PDBSymbol,std::allocator<PDBSymbol>>>,__gnu_cxx::__ops::_Iter_comp_iter<ReadEverything(PDB::RawFile_const&,PDB::DBIStream_const&,DebugInfo&)::__1>>
                    (pPVar5,pPVar20);
        }
        else {
          pPVar22 = pPVar5 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<PDBSymbol*,std::vector<PDBSymbol,std::allocator<PDBSymbol>>>,__gnu_cxx::__ops::_Iter_comp_iter<ReadEverything(PDB::RawFile_const&,PDB::DBIStream_const&,DebugInfo&)::__1>>
                    (pPVar5,pPVar22);
          for (; pPVar22 != pPVar20; pPVar22 = pPVar22 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<PDBSymbol*,std::vector<PDBSymbol,std::allocator<PDBSymbol>>>,__gnu_cxx::__ops::_Val_comp_iter<ReadEverything(PDB::RawFile_const&,PDB::DBIStream_const&,DebugInfo&)::__1>>
                      (pPVar22);
          }
        }
      }
      this = local_1f8;
      if (sVar6 != 0) {
        PDB::CreateTPIStream((TPIStream *)local_2f8,&local_1c8);
        TypeTable::TypeTable(&local_60,(TPIStream *)local_2f8);
        local_278._M_buckets = &local_278._M_single_bucket;
        local_278._M_bucket_count = 1;
        local_278._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_278._M_element_count = 0;
        local_278._M_rehash_policy._M_max_load_factor = 1.0;
        local_278._M_rehash_policy._M_next_resize = 0;
        local_278._M_single_bucket = (__node_base_ptr)0x0;
        lVar18 = 0;
        sVar23 = sVar6;
        do {
          pPVar5 = local_298.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (*(int *)((long)&(local_298.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>.
                               _M_impl.super__Vector_impl_data._M_start)->length + lVar18) == 0) {
            uVar9 = *(uint32_t *)
                     ((long)&(local_298.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>.
                              _M_impl.super__Vector_impl_data._M_start)->typeIndex + lVar18);
            if (uVar9 != 0) {
              sVar12 = PDBGetTypeSize(&local_60,uVar9);
              local_188[0] = *(undefined4 *)((long)&pPVar5->typeIndex + lVar18);
              local_180 = sVar12;
              std::
              _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_int_const,unsigned_long>>
                        ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&local_278,local_188);
              if (sVar12 != 0) {
                *(int *)((long)&pPVar5->length + lVar18) = (int)sVar12;
              }
            }
            pSVar13 = ContribFromSectionOffset
                                (local_318.
                                 super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                                 ((long)local_318.
                                        super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_318.
                                        super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555,*(uint32_t *)((long)&pPVar5->section + lVar18),
                                 *(uint32_t *)((long)&pPVar5->offset + lVar18));
            if ((pSVar13 != (SectionContrib *)0x0) &&
               (pSVar13->Length <= *(int *)((long)&pPVar5->length + lVar18) - 1U)) {
              *(uint32_t *)((long)&pPVar5->length + lVar18) = pSVar13->Length;
            }
            if (((sVar23 != 1) &&
                (uVar14 = *(int *)((long)&local_298.
                                          super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>.
                                          _M_impl.super__Vector_impl_data._M_start[1].rva + lVar18)
                          - *(int *)((long)&pPVar5->rva + lVar18), uVar14 != 0)) &&
               (uVar14 <= *(int *)((long)&pPVar5->length + lVar18) - 1U)) {
              *(uint *)((long)&pPVar5->length + lVar18) = uVar14;
            }
          }
          lVar18 = lVar18 + 0x38;
          sVar23 = sVar23 - 1;
        } while (sVar23 != 0);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_278);
        TypeTable::~TypeTable(&local_60);
      }
      pPVar5 = local_298.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (local_298.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_298.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        auVar30._8_4_ = (int)(sVar6 >> 0x20);
        auVar30._0_8_ = sVar6;
        auVar30._12_4_ = 0x45300000;
        dStack_200 = auVar30._8_8_ - 1.9342813113834067e+25;
        local_208 = dStack_200 + ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0);
        sVar27 = 1;
        pPVar20 = local_298.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          if (sVar27 == 0) {
            ReadDebugInfo();
          }
          uVar9 = pPVar20->length;
          pSVar13 = ContribFromSectionOffset
                              (local_318.
                               super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               ((long)local_318.
                                      super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_318.
                                      super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555,pPVar20->section,pPVar20->offset);
          if (pSVar13 == (SectionContrib *)0x0) {
            uVar21 = 0;
            SVar16 = Unknown;
          }
          else {
            SVar16 = pSVar13->Type;
            uVar21 = pSVar13->ObjFileIndex;
            if (uVar9 == 0) {
              uVar9 = pSVar13->Length;
            }
          }
          local_2f8._0_8_ = local_2f8 + 0x10;
          local_2f8._8_8_ = (Byte *)0x0;
          stack0xfffffffffffffd18 = stack0xfffffffffffffd18 & 0xffffffffffffff00;
          local_2d8.version = 0;
          local_2d8.headerSize = 0;
          local_2d8.typeIndexBegin = 0;
          local_2d8.typeIndexEnd = 0;
          sVar3 = (pPVar20->name)._M_string_length;
          local_278._M_buckets = &local_278._M_before_begin._M_nxt;
          if (sVar3 == 0) {
            local_278._M_before_begin._M_nxt = (_Hash_node_base *)0x3e656d616e6f6e3c;
            local_278._M_bucket_count = 8;
            local_278._M_element_count = local_278._M_element_count & 0xffffffffffffff00;
          }
          else {
            pcVar4 = (pPVar20->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>((string *)&local_278,pcVar4,pcVar4 + sVar3);
          }
          std::__cxx11::string::_M_assign((string *)local_2f8);
          if ((__node_base *)local_278._M_buckets != &local_278._M_before_begin) {
            operator_delete(local_278._M_buckets,
                            (ulong)((long)&(local_278._M_before_begin._M_nxt)->_M_nxt + 1));
          }
          local_2d8.typeIndexEnd = SVar16;
          local_2d8.typeIndexBegin = uVar9;
          local_2d8.headerSize = uVar21;
          local_2d8.version = DebugInfo::GetNameSpaceIndex(this,&pPVar20->name);
          std::vector<SymbolInfo,std::allocator<SymbolInfo>>::emplace_back<SymbolInfo&>
                    ((vector<SymbolInfo,std::allocator<SymbolInfo>> *)this,(SymbolInfo *)local_2f8);
          if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
            operator_delete((void *)local_2f8._0_8_,stack0xfffffffffffffd18 + 1);
          }
          pPVar20 = pPVar20 + 1;
          sVar27 = sVar27 + 1;
        } while (pPVar20 != pPVar5);
      }
      std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>::~vector(&local_298);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_PDBSymbol>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_PDBSymbol>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_240);
      if (local_318.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl.
          super__Vector_impl_data._M_start != (SectionContrib *)0x0) {
        operator_delete(local_318.
                        super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_318.
                              super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_318.
                              super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      PDB::CoalescedMSFStream::~CoalescedMSFStream(&local_1e0);
      PDB::CoalescedMSFStream::~CoalescedMSFStream(&local_e8.m_stream);
      PDB::ModuleInfoStream::~ModuleInfoStream(&local_138);
      PDB::CoalescedMSFStream::~CoalescedMSFStream(&local_178.m_stream);
      uVar15 = (undefined1)local_2fc;
    }
    PDB::CoalescedMSFStream::~CoalescedMSFStream(&local_110.m_stream);
  }
  else {
    uVar15 = 0;
    fprintf(_stderr,"  PDB file \'%s\' does not have valid DBI stream, error code %i\n",fileName,
            (ulong)EVar8);
  }
  PDB::RawFile::~RawFile(&local_1c8);
LAB_0010bb85:
  MemoryMappedFile::~MemoryMappedFile(&local_150);
  return (bool)uVar15;
}

Assistant:

bool ReadDebugInfo(const char *fileName, DebugInfo &to)
{
    // open the PDB file
    MemoryMappedFile pdbFile(fileName);
    if (pdbFile.baseAddress == nullptr)
    {
        fprintf(stderr, "  failed to memory-map PDB file '%s'\n", fileName);
        return false;
    }
    PDB::ErrorCode errorCode = PDB::ValidateFile(pdbFile.baseAddress);
    if (errorCode != PDB::ErrorCode::Success)
    {
        fprintf(stderr, "  failed to validate PDB file '%s': error code %i\n", fileName, (int)errorCode);
        return false;
    }
    const PDB::RawFile rawPdbFile = PDB::CreateRawFile(pdbFile.baseAddress);
    errorCode = PDB::HasValidDBIStream(rawPdbFile);
    if (errorCode != PDB::ErrorCode::Success)
    {
        fprintf(stderr, "  PDB file '%s' does not have valid DBI stream, error code %i\n", fileName, (int)errorCode);
        return false;
    }
    const PDB::InfoStream infoStream(rawPdbFile);
    if (infoStream.UsesDebugFastLink())
    {
        fprintf(stderr, "  PDB file '%s' uses unsupported option /DEBUG:FASTLINK\n", fileName);
        return false;
    }
    const PDB::DBIStream dbiStream = PDB::CreateDBIStream(rawPdbFile);
    if (!HasValidDBIStreams(rawPdbFile, dbiStream))
    {
        fprintf(stderr, "  PDB file '%s' does not have required DBI sections\n", fileName);
        return false;
    }

    if (dbiStream.GetHeader().flags & 0x1)
    {
        printf("Warning: PDB file is created with incremental linking, some information might be misleading.\n");
    }
    if (dbiStream.GetHeader().flags & 0x2)
    {
        printf("Warning: PDB file is stripped, some information might be missing or misleading.\n");
    }

    ReadEverything(rawPdbFile, dbiStream, to);

    return true;
}